

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

void __thiscall QMakeEvaluator::~QMakeEvaluator(QMakeEvaluator *this)

{
  int *piVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    piVar1 = *(int **)((long)&this->m_tmp[1].d.d + lVar5);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)&this->m_tmp[1].d.d + lVar5),2,0x10);
      }
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x30);
  pDVar2 = (this->m_tmp3).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_tmp3).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_tmp2).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_tmp2).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_tmp1).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_tmp1).d.d)->super_QArrayData,2,0x10);
    }
  }
  std::__cxx11::
  _List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::_M_clear
            ((_List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
              *)&this->m_valuemapStack);
  QArrayDataPointer<ProString>::~QArrayDataPointer
            ((QArrayDataPointer<ProString> *)&this->m_returnValue);
  QHash<ProKey,_ProFunctionDef>::~QHash(&(this->m_functionDefs).replaceFunctions);
  QHash<ProKey,_ProFunctionDef>::~QHash(&(this->m_functionDefs).testFunctions);
  pDVar2 = (this->m_dirSep).m_string.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->m_dirSep).m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::~QExplicitlySharedDataPointer
            (&this->m_featureRoots);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_mkspecPaths).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_qmakefeatures).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_qmakepath).d);
  pDVar2 = (this->m_buildRoot).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_buildRoot).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_sourceRoot).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_sourceRoot).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_stashfile).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_stashfile).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_cachefile).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_cachefile).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_conffile).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_conffile).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_superfile).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_superfile).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_qmakespecName).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_qmakespecName).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_qmakespec).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_qmakespec).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_outputDir).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_outputDir).d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer
            ((QArrayDataPointer<ProString> *)&this->m_extraConfigs);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->m_extraVars).d);
  pDVar3 = (this->m_profileStack).super_QList<ProFile_*>.d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate
                (&((this->m_profileStack).super_QList<ProFile_*>.d.d)->super_QArrayData,8,0x10);
    }
  }
  pDVar4 = (this->m_locationStack).super_QList<QMakeEvaluator::Location>.d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate
                (&((this->m_locationStack).super_QList<QMakeEvaluator::Location>.d.d)->
                  super_QArrayData,0x10,0x10);
      return;
    }
  }
  return;
}

Assistant:

QMakeEvaluator::~QMakeEvaluator()
{
}